

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequenceDistanceGraphPath.cc
# Opt level: O3

bool __thiscall
SequenceDistanceGraphPath::operator==
          (SequenceDistanceGraphPath *this,SequenceDistanceGraphPath *rhs)

{
  bool bVar1;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> _Stack_68;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_38;
  
  make_set_of_nodes((set<long,_std::less<long>,_std::allocator<long>_> *)&_Stack_68,this);
  make_set_of_nodes((set<long,_std::less<long>,_std::allocator<long>_> *)&local_38,rhs);
  if (_Stack_68._M_impl.super__Rb_tree_header._M_node_count ==
      local_38._M_impl.super__Rb_tree_header._M_node_count) {
    bVar1 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<long>,std::_Rb_tree_const_iterator<long>>
                      ((_Rb_tree_const_iterator<long>)
                       _Stack_68._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<long>)&_Stack_68._M_impl.super__Rb_tree_header,
                       (_Rb_tree_const_iterator<long>)
                       local_38._M_impl.super__Rb_tree_header._M_header._M_left);
  }
  else {
    bVar1 = false;
  }
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_38);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&_Stack_68);
  return bVar1;
}

Assistant:

bool SequenceDistanceGraphPath::operator==(const SequenceDistanceGraphPath& rhs) const {
    return make_set_of_nodes() == rhs.make_set_of_nodes();
}